

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O0

bool LookupOne(CDBWrapper *db,CBlockIndex *block_index,DBVal *result)

{
  bool bVar1;
  void *in_RDX;
  CBlockIndex *in_RDI;
  long in_FS_OFFSET;
  pair<uint256,_(anonymous_namespace)::DBVal> read_out;
  DBHashKey *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  CBlockIndex *in_stack_fffffffffffffef8;
  bool local_d5;
  pair<uint256,_(anonymous_namespace)::DBVal> *in_stack_ffffffffffffff30;
  DBHashKey *in_stack_ffffffffffffff38;
  CDBWrapper *in_stack_ffffffffffffff40;
  undefined1 auStack_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::pair<uint256,_(anonymous_namespace)::DBVal>::
  pair<uint256,_(anonymous_namespace)::DBVal,_true>
            ((pair<uint256,_(anonymous_namespace)::DBVal> *)in_stack_fffffffffffffef8);
  anon_unknown.dwarf_ca4292::DBHeightKey::DBHeightKey((DBHeightKey *)in_stack_fffffffffffffee8,0);
  bVar1 = CDBWrapper::
          Read<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                    (in_stack_ffffffffffffff40,(DBHeightKey *)in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    CBlockIndex::GetBlockHash(in_stack_fffffffffffffef8);
    bVar1 = operator==((base_blob<256U> *)in_stack_fffffffffffffef8,
                       (base_blob<256U> *)
                       CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    if (bVar1) {
      memcpy(in_RDX,auStack_50,0x48);
      local_d5 = true;
    }
    else {
      CBlockIndex::GetBlockHash(in_RDI);
      anon_unknown.dwarf_ca4292::DBHashKey::DBHashKey(in_stack_fffffffffffffee8,(uint256 *)0x92474a)
      ;
      local_d5 = CDBWrapper::Read<(anonymous_namespace)::DBHashKey,(anonymous_namespace)::DBVal>
                           (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                            (DBVal *)in_stack_ffffffffffffff30);
    }
  }
  else {
    local_d5 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_d5;
  }
  __stack_chk_fail();
}

Assistant:

static bool LookupOne(const CDBWrapper& db, const CBlockIndex* block_index, DBVal& result)
{
    // First check if the result is stored under the height index and the value there matches the
    // block hash. This should be the case if the block is on the active chain.
    std::pair<uint256, DBVal> read_out;
    if (!db.Read(DBHeightKey(block_index->nHeight), read_out)) {
        return false;
    }
    if (read_out.first == block_index->GetBlockHash()) {
        result = std::move(read_out.second);
        return true;
    }

    // If value at the height index corresponds to an different block, the result will be stored in
    // the hash index.
    return db.Read(DBHashKey(block_index->GetBlockHash()), result);
}